

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotBarsEx<ImPlot::GetterBarV<double>>
               (char *label_id,GetterBarV<double> *getter,double width)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  double *pdVar8;
  ImPlotPlot *pIVar9;
  ImPlotContext *pIVar10;
  bool bVar11;
  ImU32 col;
  ImU32 col_00;
  ImDrawList *this;
  int iVar12;
  int iVar13;
  ImPlotRange *pIVar14;
  int iVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  ImVec2 b;
  ImVec2 a;
  ImVec2 local_40;
  ImVec2 local_38;
  
  bVar11 = BeginItem(label_id,1);
  pIVar10 = GImPlot;
  if (bVar11) {
    dVar21 = width * 0.5;
    if ((GImPlot->FitThisFrame == true) && (iVar12 = getter->Count, 0 < iVar12)) {
      dVar1 = getter->XShift;
      pdVar8 = getter->Ys;
      iVar13 = getter->Offset;
      iVar4 = getter->Stride;
      pIVar9 = GImPlot->CurrentPlot;
      iVar5 = pIVar9->CurrentYAxis;
      uVar6 = (pIVar9->XAxis).Flags;
      pIVar14 = GImPlot->ExtentsY + iVar5;
      uVar7 = pIVar9->YAxis[iVar5].Flags;
      iVar15 = 0;
      dVar16 = 0.0;
      do {
        dVar17 = dVar1 + dVar16;
        dVar18 = *(double *)
                  ((long)pdVar8 +
                  (long)(((iVar13 + iVar15) % iVar12 + iVar12) % iVar12) * (long)iVar4);
        dVar19 = dVar17 - dVar21;
        if ((uVar6 >> 10 & 1) == 0) {
          if ((long)ABS(dVar19) < 0x7ff0000000000000) {
LAB_001f5d63:
            if ((0.0 < dVar19) || ((uVar6 & 0x20) == 0)) {
              dVar2 = (pIVar10->ExtentsX).Min;
              dVar20 = dVar19;
              if (dVar2 <= dVar19) {
                dVar20 = dVar2;
              }
              (pIVar10->ExtentsX).Min = dVar20;
              dVar2 = (pIVar10->ExtentsX).Max;
              dVar20 = dVar19;
              if (dVar19 <= dVar2) {
                dVar20 = dVar2;
              }
              (pIVar10->ExtentsX).Max = dVar20;
            }
          }
        }
        else if ((((long)ABS(dVar19) < 0x7ff0000000000000) &&
                 (pIVar9->YAxis[iVar5].Range.Min <= dVar18)) &&
                (dVar18 <= pIVar9->YAxis[iVar5].Range.Max)) goto LAB_001f5d63;
        if ((uVar7 >> 10 & 1) == 0) {
          if ((ulong)ABS(dVar18) < 0x7ff0000000000000) {
LAB_001f5dd5:
            if ((0.0 < dVar18) || ((uVar7 & 0x20) == 0)) {
              dVar19 = dVar18;
              if (pIVar14->Min <= dVar18) {
                dVar19 = pIVar14->Min;
              }
              pIVar14->Min = dVar19;
              dVar19 = pIVar10->ExtentsY[iVar5].Max;
              if (dVar18 <= dVar19) {
                dVar18 = dVar19;
              }
              pIVar10->ExtentsY[iVar5].Max = dVar18;
            }
          }
        }
        else if ((((ulong)ABS(dVar18) < 0x7ff0000000000000) && ((pIVar9->XAxis).Range.Min <= dVar19)
                 ) && (dVar19 <= (pIVar9->XAxis).Range.Max)) goto LAB_001f5dd5;
        dVar17 = dVar17 + dVar21;
        if ((uVar6 >> 10 & 1) == 0) {
          if ((long)ABS(dVar17) < 0x7ff0000000000000) {
LAB_001f5e37:
            if ((0.0 < dVar17) || ((uVar6 & 0x20) == 0)) {
              dVar18 = (pIVar10->ExtentsX).Min;
              dVar19 = dVar17;
              if (dVar18 <= dVar17) {
                dVar19 = dVar18;
              }
              (pIVar10->ExtentsX).Min = dVar19;
              dVar18 = (pIVar10->ExtentsX).Max;
              dVar19 = dVar17;
              if (dVar17 <= dVar18) {
                dVar19 = dVar18;
              }
              (pIVar10->ExtentsX).Max = dVar19;
            }
          }
        }
        else if ((((long)ABS(dVar17) < 0x7ff0000000000000) &&
                 (pIVar9->YAxis[iVar5].Range.Min <= 0.0)) && (0.0 <= pIVar9->YAxis[iVar5].Range.Max)
                ) goto LAB_001f5e37;
        if ((uVar7 >> 10 & 1) == 0) {
          if ((uVar7 & 0x20) == 0) {
LAB_001f5e9c:
            dVar18 = 0.0;
            if (pIVar14->Min <= 0.0) {
              dVar18 = pIVar14->Min;
            }
            pIVar14->Min = dVar18;
            dVar18 = pIVar10->ExtentsY[iVar5].Max;
            dVar17 = 0.0;
            if (0.0 <= dVar18) {
              dVar17 = dVar18;
            }
            pIVar10->ExtentsY[iVar5].Max = dVar17;
          }
        }
        else if ((((uVar7 & 0x20) == 0) && ((pIVar9->XAxis).Range.Min <= dVar17)) &&
                (dVar17 <= (pIVar9->XAxis).Range.Max)) goto LAB_001f5e9c;
        dVar16 = dVar16 + 1.0;
        iVar15 = iVar15 + 1;
      } while (iVar12 != iVar15);
    }
    this = GetPlotDrawList();
    col = ImGui::GetColorU32((pIVar10->NextItemData).Colors);
    col_00 = ImGui::GetColorU32((pIVar10->NextItemData).Colors + 1);
    iVar12 = getter->Count;
    if (0 < iVar12) {
      bVar11 = (pIVar10->NextItemData).RenderFill;
      bVar3 = (pIVar10->NextItemData).RenderLine;
      iVar13 = 0;
      do {
        dVar1 = *(double *)
                 ((long)getter->Ys +
                 (long)(((getter->Offset + iVar13) % iVar12 + iVar12) % iVar12) *
                 (long)getter->Stride);
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          dVar16 = (double)iVar13 + getter->XShift;
          local_38 = PlotToPixels(dVar16 - dVar21,dVar1,-1);
          local_40 = PlotToPixels(dVar16 + dVar21,0.0,-1);
          if ((pIVar10->NextItemData).RenderFill == true) {
            ImDrawList::AddRectFilled(this,&local_38,&local_40,col_00,0.0,0);
          }
          if (((bVar11 ^ 1U | col != col_00) & bVar3) != 0) {
            ImDrawList::AddRect(this,&local_38,&local_40,col,0.0,0xf0,
                                (pIVar10->NextItemData).LineWeight);
          }
        }
        iVar13 = iVar13 + 1;
        iVar12 = getter->Count;
      } while (iVar13 < iVar12);
    }
    pIVar10 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar10->NextItemData);
    pIVar10->PreviousItem = pIVar10->CurrentItem;
    pIVar10->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotBarsEx(const char* label_id, const Getter& getter, double width) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        const double half_width = width / 2;
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(ImPlotPoint(p.x - half_width, p.y));
                FitPoint(ImPlotPoint(p.x + half_width, 0));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        ImU32 col_line  = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
        ImU32 col_fill  = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
        bool  rend_line = s.RenderLine;
        if (s.RenderFill && col_line == col_fill)
            rend_line = false;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPoint p = getter(i);
            if (p.y == 0)
                continue;
            ImVec2 a = PlotToPixels(p.x - half_width, p.y);
            ImVec2 b = PlotToPixels(p.x + half_width, 0);
            if (s.RenderFill)
                DrawList.AddRectFilled(a, b, col_fill);
            if (rend_line)
                DrawList.AddRect(a, b, col_line, 0, ImDrawFlags_RoundCornersAll, s.LineWeight);
        }
        EndItem();
    }
}